

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_2_to_1_bilinear
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int dst_w,
               int dst_h,__m128i c0c1)

{
  long in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  longlong *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar1;
  __m128i c0c1_00;
  __m128i c0c1_01;
  __m128i d [2];
  __m128i s [2];
  int x;
  int y;
  int max_width;
  longlong local_f8;
  undefined8 uStack_f0;
  longlong local_e8;
  undefined8 uStack_e0;
  uint local_d4;
  int local_d0;
  uint local_cc;
  long local_a8;
  undefined8 *local_a0;
  longlong local_98;
  longlong *local_90;
  undefined8 *local_70;
  undefined8 *local_68;
  longlong *local_60;
  longlong *local_58;
  longlong *local_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  local_cc = in_R8D + 0xfU & 0xfffffff0;
  local_d0 = in_R9D;
  local_a8 = in_RCX;
  local_a0 = in_RDX;
  local_98 = in_RSI;
  local_90 = in_RDI;
  do {
    local_d4 = local_cc;
    do {
      local_50 = local_90;
      local_f8 = *local_90;
      uStack_f0 = local_90[1];
      local_58 = local_90 + 2;
      local_e8 = *local_58;
      uStack_e0 = local_90[3];
      alVar1[1] = (longlong)in_RDX;
      alVar1[0] = in_RSI;
      alVar1 = scale_plane_bilinear_kernel((__m128i *)&local_f8,alVar1);
      c0c1_00[1] = alVar1[1];
      local_60 = (longlong *)((long)local_90 + local_98);
      local_f8 = *local_60;
      uStack_f0 = local_60[1];
      local_68 = (undefined8 *)((long)local_90 + local_98 + 0x10);
      local_e8 = *local_68;
      uStack_e0 = local_68[1];
      c0c1_00[0] = in_RSI;
      alVar1 = scale_plane_bilinear_kernel((__m128i *)&local_f8,c0c1_00);
      c0c1_01[1] = alVar1[1];
      uStack_37 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
      uStack_36 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_35 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
      uStack_34 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_33 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
      uStack_32 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
      uStack_31 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
      local_48 = (undefined1)extraout_XMM0_Qa_00;
      uStack_47 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
      uStack_46 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      uStack_45 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
      uStack_44 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      uStack_43 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
      uStack_42 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      uStack_41 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
      local_f8 = CONCAT17(uStack_45,
                          CONCAT16(uStack_35,
                                   CONCAT15(uStack_46,
                                            CONCAT14(uStack_36,
                                                     CONCAT13(uStack_47,
                                                              CONCAT12(uStack_37,
                                                                       CONCAT11(local_48,(char)
                                                  extraout_XMM0_Qa)))))));
      uStack_f0 = CONCAT17(uStack_41,
                           CONCAT16(uStack_31,
                                    CONCAT15(uStack_42,
                                             CONCAT14(uStack_32,
                                                      CONCAT13(uStack_43,
                                                               CONCAT12(uStack_33,
                                                                        CONCAT11(uStack_44,uStack_34
                                                                                )))))));
      uStack_f = (undefined1)((ulong)extraout_XMM0_Qb >> 8);
      uStack_e = (undefined1)((ulong)extraout_XMM0_Qb >> 0x10);
      uStack_d = (undefined1)((ulong)extraout_XMM0_Qb >> 0x18);
      uStack_c = (undefined1)((ulong)extraout_XMM0_Qb >> 0x20);
      uStack_b = (undefined1)((ulong)extraout_XMM0_Qb >> 0x28);
      uStack_a = (undefined1)((ulong)extraout_XMM0_Qb >> 0x30);
      uStack_9 = (undefined1)((ulong)extraout_XMM0_Qb >> 0x38);
      uStack_20 = (undefined1)extraout_XMM0_Qb_00;
      uStack_1f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
      uStack_1e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      uStack_1d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
      uStack_1c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      uStack_1b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
      uStack_1a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      uStack_19 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
      local_e8 = CONCAT17(uStack_1d,
                          CONCAT16(uStack_d,CONCAT15(uStack_1e,
                                                     CONCAT14(uStack_e,CONCAT13(uStack_1f,
                                                                                CONCAT12(uStack_f,
                                                  CONCAT11(uStack_20,(char)extraout_XMM0_Qb)))))));
      uStack_e0 = CONCAT17(uStack_19,
                           CONCAT16(uStack_9,CONCAT15(uStack_1a,
                                                      CONCAT14(uStack_a,CONCAT13(uStack_1b,
                                                                                 CONCAT12(uStack_b,
                                                  CONCAT11(uStack_1c,uStack_c)))))));
      c0c1_01[0] = in_RSI;
      alVar1 = scale_plane_bilinear_kernel((__m128i *)&local_f8,c0c1_01);
      in_RDX = alVar1[1];
      local_70 = local_a0;
      *local_a0 = extraout_XMM0_Qa_01;
      local_a0[1] = extraout_XMM0_Qb_01;
      local_90 = local_90 + 4;
      local_a0 = local_a0 + 2;
      local_d4 = local_d4 - 0x10;
    } while (local_d4 != 0);
    local_90 = (longlong *)((local_98 - (int)local_cc) * 2 + (long)local_90);
    local_a0 = (undefined8 *)((local_a8 - (int)local_cc) + (long)local_a0);
    local_d0 = local_d0 + -1;
  } while (local_d0 != 0);
  return;
}

Assistant:

static void scale_plane_2_to_1_bilinear(const uint8_t *src,
                                        const ptrdiff_t src_stride,
                                        uint8_t *dst,
                                        const ptrdiff_t dst_stride,
                                        const int dst_w, const int dst_h,
                                        const __m128i c0c1) {
  const int max_width = (dst_w + 15) & ~15;
  int y = dst_h;

  do {
    int x = max_width;
    do {
      __m128i s[2], d[2];

      // Horizontal
      // Even rows
      s[0] = _mm_loadu_si128((const __m128i *)(src + 0));
      s[1] = _mm_loadu_si128((const __m128i *)(src + 16));
      d[0] = scale_plane_bilinear_kernel(s, c0c1);

      // odd rows
      s[0] = _mm_loadu_si128((const __m128i *)(src + src_stride + 0));
      s[1] = _mm_loadu_si128((const __m128i *)(src + src_stride + 16));
      d[1] = scale_plane_bilinear_kernel(s, c0c1);

      // Vertical
      s[0] = _mm_unpacklo_epi8(d[0], d[1]);
      s[1] = _mm_unpackhi_epi8(d[0], d[1]);
      d[0] = scale_plane_bilinear_kernel(s, c0c1);

      _mm_storeu_si128((__m128i *)dst, d[0]);
      src += 32;
      dst += 16;
      x -= 16;
    } while (x);
    src += 2 * (src_stride - max_width);
    dst += dst_stride - max_width;
  } while (--y);
}